

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coord.cpp
# Opt level: O0

ostream * despot::operator<<(ostream *os,Coord *coord)

{
  ostream *poVar1;
  Coord *coord_local;
  ostream *os_local;
  
  poVar1 = std::operator<<(os,"(");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,coord->x);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,coord->y);
  std::operator<<(poVar1,")");
  return os;
}

Assistant:

ostream& operator<<(ostream& os, const Coord& coord) {
	os << "(" << coord.x << ", " << coord.y << ")";
	return os;
}